

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_device.c
# Opt level: O0

MPP_RET mpp_dev_init(MppDev *ctx,MppClientType type)

{
  RK_U32 RVar1;
  MppIoctlVersion MVar2;
  MppClientType *ptr;
  void *ptr_00;
  void *impl_ctx;
  MppDevImpl *impl;
  MppDevApi *api;
  MppIoctlVersion ioctl_version;
  RK_U32 codec_type;
  MppClientType type_local;
  MppDev *ctx_local;
  
  if (ctx == (MppDev *)0x0) {
    _mpp_log_l(2,"mpp_device","found NULL input ctx\n","mpp_dev_init");
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    mpp_env_get_u32("mpp_device_debug",&mpp_device_debug,0);
    *ctx = (MppDev)0x0;
    RVar1 = mpp_get_vcodec_type();
    if ((RVar1 & 1 << ((byte)type & 0x1f)) == 0) {
      _mpp_log_l(2,"mpp_device","found unsupported client type %d in platform %x\n","mpp_dev_init",
                 (ulong)type,(ulong)RVar1);
      ctx_local._4_4_ = MPP_ERR_VALUE;
    }
    else {
      MVar2 = mpp_get_ioctl_version();
      if (MVar2 == IOCTL_VCODEC_SERVICE) {
        impl = (MppDevImpl *)&vcodec_service_api;
      }
      else {
        if (MVar2 != IOCTL_MPP_SERVICE_V1) {
          _mpp_log_l(2,"mpp_device","invalid ioctl verstion %d\n","mpp_dev_init",(ulong)MVar2);
          return MPP_NOK;
        }
        impl = (MppDevImpl *)&mpp_service_api;
      }
      ptr = (MppClientType *)mpp_osal_calloc("mpp_dev_init",0x18);
      ptr_00 = mpp_osal_calloc("mpp_dev_init",(ulong)*(uint *)&impl->ctx);
      if ((ptr == (MppClientType *)0x0) || (ptr_00 == (void *)0x0)) {
        _mpp_log_l(2,"mpp_device","malloc failed impl %p impl_ctx %p\n","mpp_dev_init",ptr,ptr_00);
        if (ptr != (MppClientType *)0x0) {
          mpp_osal_free("mpp_dev_init",ptr);
        }
        if (ptr_00 != (void *)0x0) {
          mpp_osal_free("mpp_dev_init",ptr_00);
        }
        ctx_local._4_4_ = MPP_ERR_MALLOC;
      }
      else {
        *(void **)(ptr + 2) = ptr_00;
        *(MppDevImpl **)(ptr + 4) = impl;
        *ptr = type;
        *ctx = ptr;
        ctx_local._4_4_ = (*(code *)impl->api)(ptr_00,type);
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET mpp_dev_init(MppDev *ctx, MppClientType type)
{
    if (NULL == ctx) {
        mpp_err_f("found NULL input ctx\n");
        return MPP_ERR_NULL_PTR;
    }

    mpp_env_get_u32("mpp_device_debug", &mpp_device_debug, 0);

    *ctx = NULL;

    RK_U32 codec_type = mpp_get_vcodec_type();
    if (!(codec_type & (1 << type))) {
        mpp_err_f("found unsupported client type %d in platform %x\n",
                  type, codec_type);
        return MPP_ERR_VALUE;
    }

    MppIoctlVersion ioctl_version = mpp_get_ioctl_version();
    const MppDevApi *api = NULL;

    switch (ioctl_version) {
    case IOCTL_VCODEC_SERVICE : {
        api = &vcodec_service_api;
    } break;
    case IOCTL_MPP_SERVICE_V1 : {
        api = &mpp_service_api;
    } break;
    default : {
        mpp_err_f("invalid ioctl verstion %d\n", ioctl_version);
        return MPP_NOK;
    } break;
    }

    MppDevImpl *impl = mpp_calloc(MppDevImpl, 1);
    void *impl_ctx = mpp_calloc_size(void, api->ctx_size);
    if (NULL == impl || NULL == impl_ctx) {
        mpp_err_f("malloc failed impl %p impl_ctx %p\n", impl, impl_ctx);
        MPP_FREE(impl);
        MPP_FREE(impl_ctx);
        return MPP_ERR_MALLOC;
    }

    impl->ctx = impl_ctx;
    impl->api = api;
    impl->type = type;
    *ctx = impl;

    return api->init(impl_ctx, type);
}